

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O2

void ncnn::gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  uint uVar18;
  uint uVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  void *local_88;
  
  iVar15 = grid->h * grid->w;
  piVar12 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    local_88 = grid->data;
    sVar5 = grid->cstep;
    sVar6 = grid->elemsize;
    for (lVar10 = 0; lVar10 < grid->c; lVar10 = lVar10 + 1) {
      for (lVar11 = 0; (int)lVar11 < iVar15; lVar11 = lVar11 + 2) {
        uVar1 = *(undefined8 *)((long)local_88 + lVar11 * 4);
        uVar3 = src->w;
        uVar8 = src->h;
        auVar24._0_4_ = ((float)uVar1 * 0.5 + 0.5) * (float)(int)uVar3 + -0.5;
        auVar24._4_4_ = ((float)((ulong)uVar1 >> 0x20) * 0.5 + 0.5) * (float)(int)uVar8 + -0.5;
        auVar24._8_8_ = 0;
        auVar25 = maxps(auVar24,_DAT_00536030);
        auVar22._0_4_ = (float)(int)uVar3 + -1.0;
        auVar22._4_4_ = (float)(int)uVar8 + -1.0;
        auVar22._8_8_ = 0;
        auVar22 = minps(auVar22,auVar25);
        fVar16 = floorf(auVar22._0_4_ + 0.5);
        fVar17 = floorf(auVar22._4_4_ + 0.5);
        uVar9 = (uint)fVar16;
        uVar18 = (uint)fVar17;
        auVar25._4_4_ = -(uint)((int)uVar9 < (int)uVar3);
        auVar25._0_4_ = -(uint)((int)uVar9 < (int)uVar3);
        auVar25._8_4_ = -(uint)((int)uVar18 < (int)uVar8);
        auVar25._12_4_ = -(uint)((int)uVar18 < (int)uVar8);
        iVar13 = -1;
        iVar14 = (uVar3 * uVar18 + uVar9) * src->elempack;
        if ((int)(uVar18 | uVar9) < 0) {
          iVar14 = iVar13;
        }
        uVar9 = movmskpd(uVar9,auVar25);
        if ((uVar9 & 1) == 0) {
          iVar14 = iVar13;
        }
        if ((uVar9 & 2) == 0) {
          iVar14 = iVar13;
        }
        *piVar12 = iVar14;
        piVar12 = piVar12 + 1;
      }
      local_88 = (void *)((long)local_88 + sVar5 * sVar6);
    }
  }
  else {
    pvVar4 = grid->data;
    sVar5 = grid->elemsize;
    sVar6 = grid->cstep;
    lVar10 = 0;
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    for (; iVar15 != (int)lVar10; lVar10 = lVar10 + 1) {
      uVar2 = src->w;
      uVar7 = src->h;
      auVar21._0_4_ = (*(float *)((long)pvVar4 + lVar10 * 4) * 0.5 + 0.5) * (float)(int)uVar2 + -0.5
      ;
      auVar21._4_4_ =
           (*(float *)((long)pvVar4 + lVar10 * 4 + sVar5 * sVar6) * 0.5 + 0.5) * (float)(int)uVar7 +
           -0.5;
      auVar21._8_8_ = 0;
      auVar22 = maxps(auVar21,_DAT_00536030);
      auVar23._0_4_ = (float)(int)uVar2 + -1.0;
      auVar23._4_4_ = (float)(int)uVar7 + -1.0;
      auVar23._8_8_ = 0;
      auVar22 = minps(auVar23,auVar22);
      fVar16 = floorf(auVar22._0_4_ + 0.5);
      fVar17 = floorf(auVar22._4_4_ + 0.5);
      uVar18 = (uint)fVar16;
      uVar20 = (uint)fVar17;
      auVar19._4_4_ = -(uint)((int)uVar18 < (int)uVar2);
      auVar19._0_4_ = -(uint)((int)uVar18 < (int)uVar2);
      auVar19._8_4_ = -(uint)((int)uVar20 < (int)uVar7);
      auVar19._12_4_ = -(uint)((int)uVar20 < (int)uVar7);
      uVar9 = movmskpd(uVar18,auVar19);
      iVar13 = -1;
      iVar14 = (uVar2 * uVar20 + uVar18) * src->elempack;
      if ((int)(uVar20 | uVar18) < 0) {
        iVar14 = iVar13;
      }
      if ((uVar9 & 1) == 0) {
        iVar14 = iVar13;
      }
      if ((uVar9 & 2) == 0) {
        iVar14 = iVar13;
      }
      piVar12[lVar10] = iVar14;
    }
  }
  return;
}

Assistant:

void gridsample_2d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 16;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

                gridptr += 2;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;

            offset_ptr++;
        }
    }
}